

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

int __thiscall vm_rcdesc::init(vm_rcdesc *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  uchar *puVar3;
  int in_ECX;
  long in_RDX;
  vm_val_t *in_R8;
  int in_R9D;
  
  this->name = (char *)ctx;
  (this->self).typ = VM_NIL;
  this->method_idx = 0;
  puVar1 = (undefined8 *)(in_RDX + 0x18 + (long)in_ECX * 0x38);
  aVar2 = *(anon_union_8_8_cb74652f_for_val *)(puVar1 + 1);
  *(undefined8 *)&this->bifptr = *puVar1;
  (this->bifptr).val = aVar2;
  this->argp = in_R8;
  this->argc = in_R9D;
  if (pc_ptr_ == (uchar **)0x0) {
    puVar3 = (uchar *)0x0;
  }
  else {
    puVar3 = *pc_ptr_;
  }
  this->caller_addr = puVar3;
  return (int)puVar3;
}

Assistant:

void vm_rcdesc::init(VMG_ const char *name,
                     const vm_bif_desc *funcset, int idx,
                     vm_val_t *argp, int argc)
{
    this->name = name;
    this->self.set_nil();
    this->method_idx = 0;
    this->bifptr = funcset[idx].bifptr;
    this->argp = argp;
    this->argc = argc;
    this->caller_addr = G_interpreter->get_last_pc();
}